

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicAtomicCase3::Cleanup(BasicAtomicCase3 *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram
            (this_00,*(GLuint *)&(this->super_ComputeShaderBase).renderTarget);
  glu::CallLogWrapper::glDeleteBuffers
            (this_00,1,(GLuint *)((long)&(this->super_ComputeShaderBase).renderTarget + 4));
  glu::CallLogWrapper::glDeleteBuffers
            (this_00,1,(GLuint *)((long)&(this->super_ComputeShaderBase).pixelFormat + 4));
  glu::CallLogWrapper::glDeleteVertexArrays
            (this_00,1,(GLuint *)&(this->super_ComputeShaderBase).pixelFormat);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glUseProgram(0);
		glDeleteProgram(m_program);
		glDeleteBuffers(1, &m_storage_buffer);
		glDeleteBuffers(1, &m_vertex_buffer);
		glDeleteVertexArrays(1, &m_vertex_array);
		return NO_ERROR;
	}